

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::ExtPubkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPubkey *this,string *string_path)

{
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string *string_path_local;
  ExtPubkey *this_local;
  
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)string_path;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_58,"ExtPubkey",&local_59);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,string_path,
                    &local_58,this->depth_);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  DerivePubkey(__return_storage_ptr__,this,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPubkey::DerivePubkey(const std::string& string_path) const {
  std::vector<uint32_t> path =
      ToArrayFromString(string_path, "ExtPubkey", depth_);
  return DerivePubkey(path);
}